

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor.c
# Opt level: O2

int coda_cursor_get_bit_size(coda_cursor *cursor,int64_t *bit_size)

{
  coda_backend cVar1;
  uint uVar2;
  coda_dynamic_type_struct *pcVar3;
  int iVar4;
  long lVar5;
  coda_type *pcVar6;
  coda_cursor cStack_328;
  
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (pcVar3 = cursor->stack[cursor->n - 1].type, pcVar3 == (coda_dynamic_type_struct *)0x0)) {
    coda_set_error(-100,"invalid cursor argument (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                   ,0x659);
    return -1;
  }
  cVar1 = pcVar3->backend;
  if (cVar1 - coda_backend_hdf4 < 5) {
    *bit_size = -1;
    return 0;
  }
  if (cVar1 != coda_backend_memory) {
    if (cVar1 != coda_backend_binary) {
      if (cVar1 == coda_backend_ascii) {
        iVar4 = coda_ascii_cursor_get_bit_size(cursor,bit_size);
        return iVar4;
      }
      return 0;
    }
    pcVar6 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
    if (99 < pcVar6->format) {
      pcVar6 = *(coda_type **)&pcVar6->type_class;
    }
    if (pcVar6->bit_size < 0) {
      uVar2 = pcVar6->type_class;
      if (uVar2 - 2 < 4) {
        if (pcVar6->size_expr != (coda_expression *)0x0) {
          iVar4 = coda_expression_eval_integer(pcVar6->size_expr,cursor,bit_size);
          if (iVar4 == 0) {
            lVar5 = *bit_size;
            if (pcVar6->bit_size == -8) {
              lVar5 = lVar5 << 3;
              *bit_size = lVar5;
            }
            if (-1 < lVar5) {
              return 0;
            }
            coda_set_error(-300,"calculated size is negative (%ld bits)");
          }
          else {
            coda_add_error_message(" for size expression");
          }
          coda_cursor_add_to_error_message(cursor);
          return -1;
        }
        *bit_size = -1;
      }
      else {
        if (uVar2 < 2) {
          iVar4 = coda_ascbin_cursor_get_bit_size(cursor,bit_size);
          return iVar4;
        }
        if (uVar2 == 6) {
          memcpy(&cStack_328,cursor,0x310);
          iVar4 = coda_ascbin_cursor_use_base_type_of_special_type(&cStack_328);
          if (iVar4 != 0) {
            return -1;
          }
          iVar4 = coda_cursor_get_bit_size(&cStack_328,bit_size);
          if (iVar4 != 0) {
            return -1;
          }
        }
      }
    }
    else {
      *bit_size = pcVar6->bit_size;
    }
    return 0;
  }
  pcVar3 = cursor->stack[(long)cursor->n + -1].type;
  if (pcVar3[1].backend == 2) {
    if (pcVar3->definition->format == coda_format_ascii) {
      iVar4 = coda_ascii_cursor_get_bit_size(cursor,bit_size);
    }
    else {
      iVar4 = coda_bin_cursor_get_bit_size(cursor,bit_size);
    }
    if (iVar4 == 0) {
      if (*bit_size < 0) {
        *bit_size = *(long *)(pcVar3 + 2) << 3;
        return 0;
      }
      return 0;
    }
  }
  else {
    if (pcVar3[1].backend != 3) {
      *bit_size = -1;
      return 0;
    }
    memcpy(&cStack_328.n,cursor,0x310);
    iVar4 = coda_cursor_use_base_type_of_special_type((coda_cursor *)&cStack_328.n);
    if (iVar4 == 0) {
      iVar4 = coda_cursor_get_bit_size((coda_cursor *)&cStack_328.n,bit_size);
      return iVar4;
    }
  }
  return -1;
}

Assistant:

LIBCODA_API int coda_cursor_get_bit_size(const coda_cursor *cursor, int64_t *bit_size)
{
    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    switch (cursor->stack[cursor->n - 1].type->backend)
    {
        case coda_backend_ascii:
            return coda_ascii_cursor_get_bit_size(cursor, bit_size);
        case coda_backend_binary:
            return coda_bin_cursor_get_bit_size(cursor, bit_size);
        case coda_backend_memory:
            return coda_mem_cursor_get_bit_size(cursor, bit_size);
        case coda_backend_hdf4:
        case coda_backend_hdf5:
        case coda_backend_cdf:
        case coda_backend_netcdf:
        case coda_backend_grib:
            *bit_size = -1;
            break;
    }

    return 0;
}